

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

precise_unit units::commoditizedUnit(string *unit_string,precise_unit actUnit,size_t *index)

{
  size_type __pos;
  pointer __s;
  unit_data uVar1;
  int iVar2;
  uint32_t uVar3;
  void *pvVar4;
  long lVar5;
  undefined8 uVar6;
  precise_unit pVar7;
  string commodStr;
  undefined8 local_90;
  size_type local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  undefined8 local_40;
  undefined8 local_38;
  
  uVar6 = actUnit._8_8_;
  if (unit_string->_M_string_length != 0) {
    __s = (unit_string->_M_dataplus)._M_p;
    local_90 = uVar6;
    pvVar4 = memchr(__s,0x7b,unit_string->_M_string_length);
    lVar5 = (long)pvVar4 - (long)__s;
    if (lVar5 != -1 && pvVar4 != (void *)0x0) {
      __pos = lVar5 + 1;
      local_88 = __pos;
      segmentcheck(unit_string,'}',&local_88);
      if ((local_88 - __pos == 2) && ((unit_string->_M_dataplus)._M_p[__pos] == '#')) {
        *index = local_88;
        uVar1 = detail::unit_data::operator*((unit_data *)&local_90,(unit_data *)((long)&count + 4))
        ;
        uVar6 = CONCAT44(local_90._4_4_,uVar1);
      }
      else {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                   __pos,(local_88 - lVar5) - 2);
        iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare(&local_80,"cells");
        if (iVar2 == 0) {
          *index = local_88;
          local_40 = 0x3ff0000000000000;
          local_38 = 0x604335a004000000;
          uVar1 = detail::unit_data::operator*((unit_data *)&local_90,(unit_data *)&local_38);
          uVar6 = CONCAT44(local_38._4_4_ | local_90._4_4_,uVar1);
        }
        else {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p == &local_80.field_2) {
            local_60.field_2._8_8_ = local_80.field_2._8_8_;
            local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
          }
          else {
            local_60._M_dataplus._M_p = local_80._M_dataplus._M_p;
          }
          local_60.field_2._M_allocated_capacity._1_7_ =
               local_80.field_2._M_allocated_capacity._1_7_;
          local_60.field_2._M_local_buf[0] = local_80.field_2._M_local_buf[0];
          local_60._M_string_length = local_80._M_string_length;
          local_80._M_string_length = 0;
          local_80.field_2._M_local_buf[0] = '\0';
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          uVar3 = getCommodity(&local_60);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          *index = local_88;
          uVar6 = CONCAT44(uVar3 | local_90._4_4_,local_90._0_4_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,
                          CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                   local_80.field_2._M_local_buf[0]) + 1);
        }
      }
    }
  }
  pVar7.base_units_ = (unit_data)(int)uVar6;
  pVar7.commodity_ = (int)((ulong)uVar6 >> 0x20);
  pVar7.multiplier_ = actUnit.multiplier_;
  return pVar7;
}

Assistant:

static precise_unit commoditizedUnit(
    const std::string& unit_string,
    precise_unit actUnit,
    size_t& index)
{
    auto ccindex = unit_string.find_first_of('{');
    if (ccindex == std::string::npos) {
        return actUnit;
    }
    ++ccindex;
    auto start = ccindex;
    segmentcheck(unit_string, '}', ccindex);
    if (ccindex - start == 2) {
        // there are a couple units that might look like commodities
        if (unit_string[start] == '#') {
            index = ccindex;
            return actUnit * count;
        }
    }
    std::string commodStr = unit_string.substr(start, ccindex - start - 1);
    if (commodStr == "cells") {
        index = ccindex;
        return actUnit * precise_unit(1.0, precise::count, commodities::cell);
    }
    auto hcode = getCommodity(std::move(commodStr));
    index = ccindex;
    return {1.0, actUnit, hcode};
}